

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<unsigned_int>>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  data_t dVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  unsafe_vector<idx_t> *puVar4;
  sel_t *psVar5;
  pointer puVar6;
  data_ptr_t pdVar7;
  unsigned_long uVar8;
  bool bVar9;
  ulong uVar10;
  idx_t b;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  
  pdVar3 = (vector_data->format).data;
  puVar4 = info->offsets;
  for (iVar12 = chunk.start; iVar12 < chunk.end; iVar12 = iVar12 + 1) {
    uVar13 = iVar12;
    if (((undefined1  [32])chunk & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      uVar13 = chunk.result_index;
    }
    psVar5 = ((vector_data->format).sel)->sel_vector;
    uVar10 = iVar12;
    if (psVar5 != (sel_t *)0x0) {
      uVar10 = (ulong)psVar5[iVar12];
    }
    puVar6 = (puVar4->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = info->result_data[uVar13];
    bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>,
                       uVar10);
    uVar8 = puVar6[uVar13];
    if (bVar9) {
      dVar1 = vector_data->valid_byte;
      puVar6[uVar13] = uVar8 + 1;
      pdVar7[uVar8] = dVar1;
      uVar2 = *(uint *)(pdVar3 + uVar10 * 4);
      *(uint *)(pdVar7 + puVar6[uVar13]) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar10 = puVar6[uVar13];
      uVar11 = uVar10;
      if (info->flip_bytes == true) {
        for (; uVar10 = uVar10 + 4, uVar11 < uVar10; uVar11 = uVar11 + 1) {
          pdVar7[uVar11] = ~pdVar7[uVar11];
          uVar10 = puVar6[uVar13];
        }
      }
      else {
        uVar10 = uVar10 + 4;
      }
      puVar6[uVar13] = uVar10;
    }
    else {
      dVar1 = vector_data->null_byte;
      puVar6[uVar13] = uVar8 + 1;
      pdVar7[uVar8] = dVar1;
    }
  }
  return;
}

Assistant:

void TemplatedConstructSortKey(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	auto &offsets = info.offsets;
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto result_index = chunk.GetResultIndex(r);
		auto idx = vector_data.format.sel->get_index(r);
		auto &offset = offsets[result_index];
		auto result_ptr = info.result_data[result_index];
		if (!vector_data.format.validity.RowIsValid(idx)) {
			// NULL value - write the null byte and skip
			result_ptr[offset++] = vector_data.null_byte;
			continue;
		}
		// valid value - write the validity byte
		result_ptr[offset++] = vector_data.valid_byte;
		idx_t encode_len = OP::Encode(result_ptr + offset, data[idx]);
		if (info.flip_bytes) {
			// descending order - so flip bytes
			for (idx_t b = offset; b < offset + encode_len; b++) {
				result_ptr[b] = ~result_ptr[b];
			}
		}
		offset += encode_len;
	}
}